

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# siamese.cpp
# Opt level: O1

SiameseResult
siamese_decode(SiameseDecoder decoder_t,SiameseOriginalPacket **packetsPtrOut,uint *countOut)

{
  long *plVar1;
  uint elementEnd;
  bool bVar2;
  SiameseResult SVar3;
  uint uVar4;
  long *plVar5;
  Decoder *decoder;
  uint uVar6;
  uint uVar7;
  SiameseResult SStack_54;
  
  if ((decoder_t == (SiameseDecoder)0x0) ||
     ((packetsPtrOut == (SiameseOriginalPacket **)0x0) == (countOut != (uint *)0x0))) {
    return Siamese_InvalidInput;
  }
  SStack_54 = Siamese_Disabled;
  if (decoder_t[0x8f0] == (SiameseDecoderImpl)0x0) {
    if (decoder_t[0x790] == (SiameseDecoderImpl)0x1) {
      decoder_t[0x790] = (SiameseDecoderImpl)0x0;
      SStack_54 = Siamese_Success;
      if (packetsPtrOut != (SiameseOriginalPacket **)0x0) {
        *packetsPtrOut = *(SiameseOriginalPacket **)(decoder_t + 0x780);
        *countOut = *(uint *)(decoder_t + 0x778);
      }
    }
    else {
      if (packetsPtrOut != (SiameseOriginalPacket **)0x0) {
        *packetsPtrOut = (SiameseOriginalPacket *)0x0;
        *countOut = 0;
      }
      bVar2 = siamese::Decoder::CheckRecoveryPossible((Decoder *)decoder_t);
      if (bVar2) {
        uVar7 = *(uint *)(decoder_t + 0x244);
        uVar6 = *(uint *)(decoder_t + 0x248);
        plVar5 = *(long **)(decoder_t + 0x238);
        uVar4 = *(uint *)(decoder_t + 0x240);
        while( true ) {
          if (uVar6 <= uVar7) {
            SVar3 = siamese::Decoder::DecodeCheckedRegion((Decoder *)decoder_t);
            if (SVar3 == Siamese_NeedMoreData) {
              bVar2 = true;
            }
            else if (SVar3 == Siamese_Success) {
              if (packetsPtrOut != (SiameseOriginalPacket **)0x0) {
                *packetsPtrOut = *(SiameseOriginalPacket **)(decoder_t + 0x780);
                *countOut = *(uint *)(decoder_t + 0x778);
              }
              SStack_54 = Siamese_Success;
              bVar2 = false;
            }
            else {
              bVar2 = false;
              SStack_54 = SVar3;
            }
            if (!bVar2) {
              return SStack_54;
            }
          }
          plVar1 = (long *)*plVar5;
          if (plVar1 == (long *)0x0) break;
          uVar7 = uVar7 + 1;
          elementEnd = *(uint *)((long)plVar1 + 0x24);
          if (*(uint *)((long)plVar1 + 0x24) <= uVar4) {
            elementEnd = uVar4;
          }
          uVar4 = siamese::DecoderPacketWindow::RangeLostPackets
                            ((DecoderPacketWindow *)(decoder_t + 0x288),uVar4,elementEnd);
          uVar6 = uVar6 + uVar4;
          *(uint *)(plVar1 + 5) = uVar6;
          plVar5 = plVar1;
          uVar4 = elementEnd;
        }
        *(long **)(decoder_t + 0x238) = plVar5;
        *(uint *)(decoder_t + 0x240) = uVar4;
        *(uint *)(decoder_t + 0x244) = uVar7;
        *(uint *)(decoder_t + 0x248) = uVar6;
      }
      SStack_54 = Siamese_NeedMoreData;
    }
  }
  return SStack_54;
}

Assistant:

SIAMESE_EXPORT SiameseResult siamese_decode(
    SiameseDecoder decoder_t,
    SiameseOriginalPacket** packetsPtrOut,
    unsigned* countOut)
{
    siamese::Decoder* decoder = reinterpret_cast<siamese::Decoder*>(decoder_t);
    if (!decoder || (!packetsPtrOut != !countOut))
        return Siamese_InvalidInput;

    return decoder->Decode(
        packetsPtrOut,
        countOut);
}